

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseValueExpression(Parser *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar1;
  byte bVar2;
  runtime_error *prVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  shared_ptr<minja::Expression> sVar5;
  ArgumentsExpression callParams_1;
  Location location;
  shared_ptr<minja::LiteralExpr> key;
  ArgumentsExpression callParams;
  shared_ptr<minja::VariableExpr> identifier;
  shared_ptr<minja::Expression> slice_end_1;
  shared_ptr<minja::Expression> slice_start;
  shared_ptr<minja::Expression> slice_end;
  shared_ptr<minja::Expression> index;
  anon_class_8_1_8991fb9c parseValue;
  shared_ptr<minja::Expression> *value;
  VariableExpr *in_stack_fffffffffffff8c8;
  Value *in_stack_fffffffffffff8d0;
  SpaceHandling in_stack_fffffffffffff8dc;
  Parser *in_stack_fffffffffffff8e0;
  Value *in_stack_fffffffffffff8f0;
  string *in_stack_fffffffffffff8f8;
  ArgumentsExpression *__args_2;
  Value *in_stack_fffffffffffff900;
  ArgumentsExpression *__args_1;
  Location *in_stack_fffffffffffff908;
  ArgumentsExpression *__args;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  Parser *this_00;
  Parser *in_stack_fffffffffffff928;
  __shared_ptr *in_stack_fffffffffffff968;
  Parser *in_stack_fffffffffffff970;
  Parser *in_stack_fffffffffffff978;
  Parser *local_680;
  undefined1 *in_stack_fffffffffffff990;
  Parser *in_stack_fffffffffffff998;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffff9f8;
  string *local_5d8;
  string *local_540;
  bool local_501;
  Parser *in_stack_fffffffffffffb28;
  undefined1 local_48b [3];
  undefined1 *local_488;
  undefined1 local_480 [40];
  pointer local_458;
  string local_428 [197];
  undefined1 local_363;
  undefined1 local_362;
  allocator<char> local_361;
  Parser *local_360;
  undefined1 local_358 [40];
  undefined8 local_330;
  __shared_ptr local_310 [23];
  allocator<char> local_2f9;
  string local_2f8 [32];
  string local_2d8 [55];
  allocator<char> local_2a1;
  string local_2a0 [32];
  string local_280 [64];
  undefined8 local_240;
  undefined1 local_222;
  allocator<char> local_221;
  string *local_220;
  string local_218 [32];
  string *local_1f8;
  undefined8 local_1f0;
  allocator<char> local_1c9;
  string local_1c8 [32];
  string local_1a8 [48];
  undefined8 local_178;
  allocator<char> local_149;
  string local_148 [32];
  string local_128 [32];
  __shared_ptr local_108 [23];
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0 [38];
  byte local_aa;
  byte local_a9;
  byte local_a7;
  byte local_a6;
  allocator<char> local_a5 [18];
  byte local_93;
  allocator<char> local_92;
  undefined1 local_91;
  string *local_90;
  string local_88 [32];
  undefined1 local_68 [32];
  string *local_48;
  undefined8 local_40;
  undefined1 local_19;
  
  local_19 = 0;
  parseValueExpression::anon_class_8_1_8991fb9c::operator()(in_stack_fffffffffffff9f8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff8d0,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff8c8);
    local_91 = 0;
    local_93 = 0;
    local_a6 = 0;
    local_a7 = 0;
    local_a9 = 0;
    local_aa = 0;
    local_501 = false;
    if (bVar1) {
      bVar1 = consumeSpaces(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc);
      local_501 = false;
      if (bVar1) {
        local_90 = local_88;
        local_91 = 1;
        std::allocator<char>::allocator();
        local_93 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (char *)in_stack_fffffffffffff908,(allocator<char> *)in_stack_fffffffffffff900);
        local_90 = (string *)local_68;
        std::allocator<char>::allocator();
        local_a6 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (char *)in_stack_fffffffffffff908,(allocator<char> *)in_stack_fffffffffffff900);
        local_91 = 0;
        local_a7 = 1;
        local_48 = local_88;
        local_40 = 2;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x2f0e3a);
        local_a9 = 1;
        __l._M_len._0_7_ = in_stack_fffffffffffff910;
        __l._M_array = (iterator)in_stack_fffffffffffff908;
        __l._M_len._7_1_ = in_stack_fffffffffffff917;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff900,__l,(allocator_type *)in_stack_fffffffffffff8f8);
        local_aa = 1;
        local_501 = peekSymbols(in_stack_fffffffffffff978,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff970);
      }
    }
    if ((local_aa & 1) != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8e0);
    }
    if ((local_a9 & 1) != 0) {
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2f0edf);
    }
    if ((local_a7 & 1) != 0) {
      local_540 = (string *)&local_48;
      do {
        local_540 = local_540 + -0x20;
        std::__cxx11::string::~string(local_540);
      } while (local_540 != local_88);
    }
    if ((local_a6 & 1) != 0) {
      std::allocator<char>::~allocator(local_a5);
    }
    if ((local_93 & 1) != 0) {
      std::allocator<char>::~allocator(&local_92);
    }
    if (local_501 == false) {
      local_48b[1] = 1;
      local_488 = local_480;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                 (char *)in_stack_fffffffffffff908,(allocator<char> *)in_stack_fffffffffffff900);
      local_48b[1] = 0;
      local_480._32_8_ = local_480;
      local_458 = (pointer)0x1;
      this_00 = (Parser *)local_48b;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x2f2214);
      __l_02._M_len._0_7_ = in_stack_fffffffffffff910;
      __l_02._M_array = (iterator)in_stack_fffffffffffff908;
      __l_02._M_len._7_1_ = in_stack_fffffffffffff917;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff900,__l_02,(allocator_type *)in_stack_fffffffffffff8f8);
      bVar2 = peekSymbols(in_stack_fffffffffffff978,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff970);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff8e0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2f226d);
      __args_1 = (ArgumentsExpression *)local_480;
      __args_2 = (ArgumentsExpression *)(local_480 + 0x20);
      do {
        __args_2 = (ArgumentsExpression *)
                   &__args_2[-1].args.
                    super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::~string((string *)__args_2);
      } while (__args_2 != __args_1);
      __args = __args_2;
      std::allocator<char>::~allocator((allocator<char> *)(local_48b + 2));
      _Var4._M_pi = extraout_RDX;
      if ((bVar2 & 1) != 0) {
        get_location(this_00);
        parseCallArgs(in_stack_fffffffffffffb28);
        std::
        make_shared<minja::CallExpr,minja::Location&,std::shared_ptr<minja::Expression>,minja::ArgumentsExpression>
                  ((Location *)__args,(shared_ptr<minja::Expression> *)__args_1,__args_2);
        std::shared_ptr<minja::Expression>::operator=
                  ((shared_ptr<minja::Expression> *)in_stack_fffffffffffff8d0,
                   (shared_ptr<minja::CallExpr> *)in_stack_fffffffffffff8c8);
        std::shared_ptr<minja::CallExpr>::~shared_ptr((shared_ptr<minja::CallExpr> *)0x2f233b);
        ArgumentsExpression::~ArgumentsExpression((ArgumentsExpression *)in_stack_fffffffffffff8d0);
        Location::~Location((Location *)0x2f2355);
        _Var4._M_pi = extraout_RDX_00;
      }
      sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var4._M_pi;
      sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<minja::Expression>)
             sVar5.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
               (char *)in_stack_fffffffffffff908,(allocator<char> *)in_stack_fffffffffffff900);
    consumeToken(in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970,
                 (SpaceHandling)((ulong)in_stack_fffffffffffff968 >> 0x20));
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    if (((bVar2 ^ 0xff) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                 (char *)in_stack_fffffffffffff908,(allocator<char> *)in_stack_fffffffffffff900);
      consumeToken(in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970,
                   (SpaceHandling)((ulong)in_stack_fffffffffffff968 >> 0x20));
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_2d8);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        parseIdentifier(in_stack_fffffffffffff928);
        bVar1 = std::__shared_ptr::operator_cast_to_bool(local_310);
        if (!bVar1) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Expected identifier in subscript");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        consumeSpaces(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc);
        local_362 = 1;
        in_stack_fffffffffffff998 = (Parser *)local_358;
        local_360 = in_stack_fffffffffffff998;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (char *)in_stack_fffffffffffff908,(allocator<char> *)in_stack_fffffffffffff900);
        local_362 = 0;
        local_358._32_8_ = local_358;
        local_330._0_1_ = true;
        local_330._1_1_ = false;
        local_330._2_1_ = false;
        local_330._3_5_ = 0;
        in_stack_fffffffffffff990 = &local_363;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x2f1d6c);
        __l_01._M_len._0_7_ = in_stack_fffffffffffff910;
        __l_01._M_array = (iterator)in_stack_fffffffffffff908;
        __l_01._M_len._7_1_ = in_stack_fffffffffffff917;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff900,__l_01,(allocator_type *)in_stack_fffffffffffff8f8);
        bVar1 = peekSymbols(in_stack_fffffffffffff978,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff970);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff8e0);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x2f1dcb);
        in_stack_fffffffffffff978 = (Parser *)local_358;
        local_680 = (Parser *)(local_358 + 0x20);
        do {
          in_stack_fffffffffffff970 = (Parser *)&local_680[-1].start;
          std::__cxx11::string::~string((string *)in_stack_fffffffffffff970);
          local_680 = in_stack_fffffffffffff970;
        } while (in_stack_fffffffffffff970 != in_stack_fffffffffffff978);
        std::allocator<char>::~allocator(&local_361);
        if (bVar1) {
          parseCallArgs(in_stack_fffffffffffffb28);
          in_stack_fffffffffffff968 = local_310;
          std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2f1e66);
          std::
          make_shared<minja::MethodCallExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::VariableExpr>,minja::ArgumentsExpression>
                    (in_stack_fffffffffffff908,
                     (shared_ptr<minja::Expression> *)in_stack_fffffffffffff900,
                     (shared_ptr<minja::VariableExpr> *)in_stack_fffffffffffff8f8,
                     (ArgumentsExpression *)in_stack_fffffffffffff8f0);
          std::shared_ptr<minja::Expression>::operator=
                    ((shared_ptr<minja::Expression> *)in_stack_fffffffffffff8d0,
                     (shared_ptr<minja::MethodCallExpr> *)in_stack_fffffffffffff8c8);
          std::shared_ptr<minja::MethodCallExpr>::~shared_ptr
                    ((shared_ptr<minja::MethodCallExpr> *)0x2f1eb6);
          ArgumentsExpression::~ArgumentsExpression
                    ((ArgumentsExpression *)in_stack_fffffffffffff8d0);
        }
        else {
          std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2f201e);
          std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2f2031);
          VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffff8c8);
          Value::Value(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
          std::make_shared<minja::LiteralExpr,minja::Location&,minja::Value>
                    ((Location *)in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
          Value::~Value(in_stack_fffffffffffff8d0);
          std::__cxx11::string::~string(local_428);
          std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2f209d);
          std::
          make_shared<minja::SubscriptExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::LiteralExpr>>
                    (in_stack_fffffffffffff908,
                     (shared_ptr<minja::Expression> *)in_stack_fffffffffffff900,
                     (shared_ptr<minja::LiteralExpr> *)in_stack_fffffffffffff8f8);
          std::shared_ptr<minja::Expression>::operator=
                    ((shared_ptr<minja::Expression> *)in_stack_fffffffffffff8d0,
                     (shared_ptr<minja::SubscriptExpr> *)in_stack_fffffffffffff8c8);
          std::shared_ptr<minja::SubscriptExpr>::~shared_ptr
                    ((shared_ptr<minja::SubscriptExpr> *)0x2f20e5);
          std::shared_ptr<minja::LiteralExpr>::~shared_ptr
                    ((shared_ptr<minja::LiteralExpr> *)0x2f20f2);
        }
        std::shared_ptr<minja::VariableExpr>::~shared_ptr
                  ((shared_ptr<minja::VariableExpr> *)0x2f216a);
      }
    }
    else {
      std::shared_ptr<minja::Expression>::shared_ptr((shared_ptr<minja::Expression> *)0x2f1032);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                 (char *)in_stack_fffffffffffff908,(allocator<char> *)in_stack_fffffffffffff900);
      consumeToken(in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970,
                   (SpaceHandling)((ulong)in_stack_fffffffffffff968 >> 0x20));
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator(&local_149);
      bVar1 = SUB81((ulong)in_stack_fffffffffffff990 >> 0x38,0);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        parseExpression(in_stack_fffffffffffff998,bVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                   (char *)in_stack_fffffffffffff908,(allocator<char> *)in_stack_fffffffffffff900);
        consumeToken(in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970,
                     (SpaceHandling)((ulong)in_stack_fffffffffffff968 >> 0x20));
        bVar2 = std::__cxx11::string::empty();
        std::__cxx11::string::~string(local_1a8);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
        if (((bVar2 ^ 0xff) & 1) == 0) {
          std::shared_ptr<minja::Expression>::operator=
                    ((shared_ptr<minja::Expression> *)in_stack_fffffffffffff8d0,
                     (shared_ptr<minja::Expression> *)in_stack_fffffffffffff8c8);
        }
        else {
          consumeSpaces(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc);
          local_222 = 1;
          local_220 = local_218;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                     (char *)in_stack_fffffffffffff908,(allocator<char> *)in_stack_fffffffffffff900)
          ;
          local_222 = 0;
          local_1f8 = local_218;
          local_1f0 = 1;
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2f1528);
          __l_00._M_len._0_7_ = in_stack_fffffffffffff910;
          __l_00._M_array = (iterator)in_stack_fffffffffffff908;
          __l_00._M_len._7_1_ = in_stack_fffffffffffff917;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff900,__l_00,(allocator_type *)in_stack_fffffffffffff8f8);
          bVar1 = peekSymbols(in_stack_fffffffffffff978,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff970);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff8e0);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x2f1587);
          local_5d8 = (string *)&local_1f8;
          do {
            local_5d8 = local_5d8 + -0x20;
            std::__cxx11::string::~string(local_5d8);
          } while (local_5d8 != local_218);
          std::allocator<char>::~allocator(&local_221);
          if (bVar1) {
            std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2f160b);
            local_240 = 0;
            std::
            make_shared<minja::SliceExpr,minja::Location&,std::shared_ptr<minja::Expression>,decltype(nullptr)>
                      (in_stack_fffffffffffff908,
                       (shared_ptr<minja::Expression> *)in_stack_fffffffffffff900,
                       (void **)in_stack_fffffffffffff8f8);
            std::shared_ptr<minja::Expression>::operator=
                      ((shared_ptr<minja::Expression> *)in_stack_fffffffffffff8d0,
                       (shared_ptr<minja::SliceExpr> *)in_stack_fffffffffffff8c8);
            std::shared_ptr<minja::SliceExpr>::~shared_ptr((shared_ptr<minja::SliceExpr> *)0x2f165f)
            ;
          }
          else {
            parseExpression(in_stack_fffffffffffff998,
                            SUB81((ulong)in_stack_fffffffffffff990 >> 0x38,0));
            std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2f181b);
            std::
            make_shared<minja::SliceExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>
                      (in_stack_fffffffffffff908,
                       (shared_ptr<minja::Expression> *)in_stack_fffffffffffff900,
                       (shared_ptr<minja::Expression> *)in_stack_fffffffffffff8f8);
            std::shared_ptr<minja::Expression>::operator=
                      ((shared_ptr<minja::Expression> *)in_stack_fffffffffffff8d0,
                       (shared_ptr<minja::SliceExpr> *)in_stack_fffffffffffff8c8);
            std::shared_ptr<minja::SliceExpr>::~shared_ptr((shared_ptr<minja::SliceExpr> *)0x2f1863)
            ;
            std::shared_ptr<minja::Expression>::~shared_ptr
                      ((shared_ptr<minja::Expression> *)0x2f1870);
          }
        }
        std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f18b9);
      }
      else {
        parseExpression(in_stack_fffffffffffff998,bVar1);
        std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2f1107);
        local_178 = 0;
        std::
        make_shared<minja::SliceExpr,minja::Location&,decltype(nullptr),std::shared_ptr<minja::Expression>>
                  (in_stack_fffffffffffff908,(void **)in_stack_fffffffffffff900,
                   (shared_ptr<minja::Expression> *)in_stack_fffffffffffff8f8);
        std::shared_ptr<minja::Expression>::operator=
                  ((shared_ptr<minja::Expression> *)in_stack_fffffffffffff8d0,
                   (shared_ptr<minja::SliceExpr> *)in_stack_fffffffffffff8c8);
        std::shared_ptr<minja::SliceExpr>::~shared_ptr((shared_ptr<minja::SliceExpr> *)0x2f115b);
        std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f1168);
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_108);
      if (!bVar1) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Empty index in subscript");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                 (char *)in_stack_fffffffffffff908,(allocator<char> *)in_stack_fffffffffffff900);
      consumeToken(in_stack_fffffffffffff978,(string *)in_stack_fffffffffffff970,
                   (SpaceHandling)((ulong)in_stack_fffffffffffff968 >> 0x20));
      bVar2 = std::__cxx11::string::empty();
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
      if ((bVar2 & 1) != 0) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"Expected closing bracket in subscript");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2f1aab);
      std::
      make_shared<minja::SubscriptExpr,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>>
                (in_stack_fffffffffffff908,
                 (shared_ptr<minja::Expression> *)in_stack_fffffffffffff900,
                 (shared_ptr<minja::Expression> *)in_stack_fffffffffffff8f8);
      std::shared_ptr<minja::Expression>::operator=
                ((shared_ptr<minja::Expression> *)in_stack_fffffffffffff8d0,
                 (shared_ptr<minja::SubscriptExpr> *)in_stack_fffffffffffff8c8);
      std::shared_ptr<minja::SubscriptExpr>::~shared_ptr
                ((shared_ptr<minja::SubscriptExpr> *)0x2f1af3);
      std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2f1b00);
    }
    consumeSpaces(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8dc);
  } while( true );
}

Assistant:

std::shared_ptr<Expression> parseValueExpression() {
      auto parseValue = [&]() -> std::shared_ptr<Expression> {
        auto location = get_location();
        auto constant = parseConstant();
        if (constant) return std::make_shared<LiteralExpr>(location, *constant);

        static std::regex null_regex(R"(null\b)");
        if (!consumeToken(null_regex).empty()) return std::make_shared<LiteralExpr>(location, Value());

        auto identifier = parseIdentifier();
        if (identifier) return identifier;

        auto braced = parseBracedExpressionOrArray();
        if (braced) return braced;

        auto array = parseArray();
        if (array) return array;

        auto dictionary = parseDictionary();
        if (dictionary) return dictionary;

        throw std::runtime_error("Expected value expression");
      };

      auto value = parseValue();

      while (it != end && consumeSpaces() && peekSymbols({ "[", "." })) {
        if (!consumeToken("[").empty()) {
            std::shared_ptr<Expression> index;
            if (!consumeToken(":").empty()) {
              auto slice_end = parseExpression();
              index = std::make_shared<SliceExpr>(slice_end->location, nullptr, std::move(slice_end));
            } else {
              auto slice_start = parseExpression();
              if (!consumeToken(":").empty()) {
                consumeSpaces();
                if (peekSymbols({ "]" })) {
                  index = std::make_shared<SliceExpr>(slice_start->location, std::move(slice_start), nullptr);
                } else {
                  auto slice_end = parseExpression();
                  index = std::make_shared<SliceExpr>(slice_start->location, std::move(slice_start), std::move(slice_end));
                }
              } else {
                index = std::move(slice_start);
              }
            }
            if (!index) throw std::runtime_error("Empty index in subscript");
            if (consumeToken("]").empty()) throw std::runtime_error("Expected closing bracket in subscript");

            value = std::make_shared<SubscriptExpr>(value->location, std::move(value), std::move(index));
        } else if (!consumeToken(".").empty()) {
            auto identifier = parseIdentifier();
            if (!identifier) throw std::runtime_error("Expected identifier in subscript");

            consumeSpaces();
            if (peekSymbols({ "(" })) {
              auto callParams = parseCallArgs();
              value = std::make_shared<MethodCallExpr>(identifier->location, std::move(value), std::move(identifier), std::move(callParams));
            } else {
              auto key = std::make_shared<LiteralExpr>(identifier->location, Value(identifier->get_name()));
              value = std::make_shared<SubscriptExpr>(identifier->location, std::move(value), std::move(key));
            }
        }
        consumeSpaces();
      }

      if (peekSymbols({ "(" })) {
        auto location = get_location();
        auto callParams = parseCallArgs();
        value = std::make_shared<CallExpr>(location, std::move(value), std::move(callParams));
      }
      return value;
    }